

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<unsigned_long,2ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
          *result)

{
  vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
  *pvVar1;
  bool bVar2;
  allocator local_109;
  string local_108;
  optional<std::array<unsigned_long,_2UL>_> local_e8;
  undefined1 local_d0 [8];
  array<unsigned_long,_2UL> value_1;
  optional<std::array<unsigned_long,_2UL>_> local_b8;
  char local_99;
  undefined1 local_98 [7];
  char c;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  array<unsigned_long,_2UL> value;
  optional<std::array<unsigned_long,_2UL>_> local_40;
  vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
  *local_28;
  vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
  *result_local;
  AsciiParser *pAStack_18;
  char sep_local;
  AsciiParser *this_local;
  
  local_28 = result;
  result_local._7_1_ = sep;
  pAStack_18 = this;
  ::std::
  vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
  ::clear(result);
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = MaybeNone(this);
    pvVar1 = local_28;
    if (bVar2) {
      nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>::optional(&local_40);
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
      ::push_back(pvVar1,&local_40);
      nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>::~optional(&local_40);
    }
    else {
      bVar2 = ParseBasicTypeTuple<unsigned_long,2ul>(this,(array<unsigned_long,_2UL> *)local_58);
      pvVar1 = local_28;
      if (!bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_78,"Not starting with the tuple value of requested type.\n",
                   &local_79);
        PushError(this,&local_78);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        return false;
      }
      nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>::
      optional<std::array<unsigned_long,_2UL>_&,_0>
                ((optional<std::array<unsigned_long,_2UL>_> *)local_98,
                 (array<unsigned_long,_2UL> *)local_58);
      ::std::
      vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
      ::push_back(pvVar1,(value_type *)local_98);
      nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>::~optional
                ((optional<std::array<unsigned_long,_2UL>_> *)local_98);
    }
    while (bVar2 = Eof(this), ((bVar2 ^ 0xffU) & 1) != 0) {
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = Char1(this,&local_99);
      if (!bVar2) {
        return false;
      }
      if (local_99 != result_local._7_1_) {
        StreamReader::seek_from_current(this->_sr,-1);
        break;
      }
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      bVar2 = MaybeNone(this);
      pvVar1 = local_28;
      if (bVar2) {
        nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>::optional(&local_b8);
        ::std::
        vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
        ::push_back(pvVar1,&local_b8);
        nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>::~optional(&local_b8);
      }
      else {
        bVar2 = ParseBasicTypeTuple<unsigned_long,2ul>(this,(array<unsigned_long,_2UL> *)local_d0);
        pvVar1 = local_28;
        if (!bVar2) break;
        nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>::
        optional<std::array<unsigned_long,_2UL>_&,_0>
                  (&local_e8,(array<unsigned_long,_2UL> *)local_d0);
        ::std::
        vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
        ::push_back(pvVar1,&local_e8);
        nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>::~optional(&local_e8);
      }
    }
    bVar2 = ::std::
            vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
            ::empty(local_28);
    if (bVar2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_108,"Empty array.\n",&local_109);
      PushError(this,&local_108);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}